

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O2

void sort_rec(int *array,int size,_func_int_void_ptr_void_ptr *comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  ulong local_48;
  int pivot;
  
  if (size < 0x10) {
    iVar3 = 1;
    if (1 < size) {
      iVar3 = size;
    }
    piVar10 = array + 1;
    uVar8 = 1;
    for (uVar4 = 0; uVar4 != iVar3 - 1; uVar4 = uVar4 + 1) {
      uVar5 = uVar4 & 0xffffffff;
      piVar11 = piVar10;
      for (uVar7 = uVar8; iVar2 = (int)uVar5, (uint)size != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = (*comp)(piVar11,array + iVar2);
        if (iVar2 != 0) {
          uVar5 = uVar7 & 0xffffffff;
        }
        piVar11 = piVar11 + 1;
      }
      iVar1 = array[uVar4];
      array[uVar4] = array[iVar2];
      array[iVar2] = iVar1;
      uVar8 = uVar8 + 1;
      piVar10 = piVar10 + 1;
    }
  }
  else {
    pivot = array[(uint)size >> 1];
    lVar12 = -1;
    local_48 = (ulong)(uint)size;
    while( true ) {
      lVar12 = (long)(int)lVar12;
      lVar6 = lVar12 * -4;
      lVar9 = lVar12 * 4;
      do {
        lVar9 = lVar9 + 4;
        lVar12 = lVar12 + 1;
        iVar3 = (*comp)((void *)((long)array + lVar9),&pivot);
        lVar6 = lVar6 + -4;
      } while (iVar3 != 0);
      local_48 = (ulong)(int)local_48;
      lVar9 = local_48 * 4;
      do {
        lVar9 = lVar9 + -4;
        local_48 = local_48 - 1;
        iVar3 = (*comp)(&pivot,(void *)((long)array + lVar9));
      } while (iVar3 != 0);
      if ((long)local_48 <= lVar12) break;
      iVar3 = array[lVar12];
      array[lVar12] = array[local_48];
      array[local_48] = iVar3;
    }
    sort_rec(array,(int)lVar12,comp);
    sort_rec((int *)((long)array - lVar6),size - (int)lVar12,comp);
  }
  return;
}

Assistant:

static void sort_rec(int* array, int size, int(*comp)(const void *, const void *))
{
    if (size <= 15)
        selectionsort(array, size, comp);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(comp(array + i, &pivot));
            do j--; while(comp(&pivot, array + j));
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec(array    , i     , comp);
        sort_rec(&array[i], size-i, comp);
    }
}